

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_mul_ppc(floatx80 a,floatx80 b,float_status *status)

{
  floatx80 fVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t a_00;
  ulong b_00;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  int32_t zExp;
  floatx80 fVar7;
  ulong local_40;
  uint64_t local_38;
  
  b_00 = b.low;
  a_00 = a.low;
  uVar3 = CONCAT71(b.low._1_7_,-1 < (long)a_00);
  if (-1 < (long)a_00 && ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0)
  {
LAB_00929881:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar1._10_6_ = (int6)(uVar3 >> 0x10);
    fVar1.high = 0xffff;
    fVar1.low = 0xc000000000000000;
    return fVar1;
  }
  uVar3 = CONCAT71(b.low._1_7_,-1 < (long)b_00);
  uVar4 = b.high & 0x7fff;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)b_00)
  goto LAB_00929881;
  uVar2 = b._8_4_ ^ a._8_4_;
  uVar3 = (ulong)uVar2;
  if ((a.high & 0x7fff) == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) ||
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        uVar4 == 0x7fff)) {
LAB_009298f9:
      fVar7 = propagateFloatx80NaN_ppc(a,b,status);
      return fVar7;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || b_00 != 0) {
LAB_0092992e:
      fVar7._8_4_ = uVar2 | 0x7fff;
      fVar7.low = 0x8000000000000000;
      fVar7._12_4_ = 0;
      return fVar7;
    }
    goto LAB_00929881;
  }
  if (uVar4 == 0x7fff) {
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
    goto LAB_009298f9;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || a_00 != 0)
    goto LAB_0092992e;
    goto LAB_00929881;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (a_00 == 0) goto LAB_009299d5;
    uVar3 = 0x3f;
    if (a_00 != 0) {
      for (; a_00 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    a_00 = a_00 << ((byte)(uVar3 ^ 0x3f) & 0x3f);
    uVar5 = 1 - (int)(uVar3 ^ 0x3f);
  }
  else {
    uVar5 = a._8_4_ & 0x7fff;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (b_00 == 0) {
LAB_009299d5:
      return (floatx80)(ZEXT416(uVar2 & 0x8000) << 0x40);
    }
    uVar3 = 0x3f;
    if (b_00 != 0) {
      for (; b_00 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    b_00 = b_00 << ((byte)(uVar3 ^ 0x3f) & 0x3f);
    uVar6 = 1 - (int)(uVar3 ^ 0x3f);
  }
  else {
    uVar6 = (uint)uVar4;
  }
  mul64To128(a_00,b_00,&local_38,&local_40);
  if ((long)local_38 < 1) {
    zExp = uVar6 + uVar5 + -0x3ffe;
  }
  else {
    local_38 = local_38 << 1 | local_40 >> 0x3f;
    local_40 = local_40 * 2;
    zExp = uVar6 + uVar5 + -0x3fff;
  }
  fVar7 = roundAndPackFloatx80_ppc
                    (status->floatx80_rounding_precision,(flag)((uVar2 & 0xffff) >> 0xf),zExp,
                     local_38,local_40,status);
  return fVar7;
}

Assistant:

floatx80 floatx80_mul(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( bExp | bSig ) == 0 ) goto invalid;
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( aExp | aSig ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    zExp = aExp + bExp - 0x3FFE;
    mul64To128( aSig, bSig, &zSig0, &zSig1 );
    if ( 0 < (int64_t) zSig0 ) {
        shortShift128Left( zSig0, zSig1, 1, &zSig0, &zSig1 );
        --zExp;
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}